

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertCompare
          (UtestShell *this,bool comparison,char *checkString,char *comparisonString,char *text,
          char *fileName,size_t lineNumber,TestTerminator *testTerminator)

{
  char *fileName_00;
  TestResult *pTVar1;
  SimpleString local_e0 [2];
  SimpleString local_c0;
  SimpleString local_b0;
  ComparisonFailure local_a0;
  char *local_38;
  char *fileName_local;
  char *text_local;
  char *comparisonString_local;
  char *checkString_local;
  UtestShell *pUStack_10;
  bool comparison_local;
  UtestShell *this_local;
  
  local_38 = fileName;
  fileName_local = text;
  text_local = comparisonString;
  comparisonString_local = checkString;
  checkString_local._7_1_ = comparison;
  pUStack_10 = this;
  pTVar1 = getTestResult(this);
  (*pTVar1->_vptr_TestResult[10])();
  fileName_00 = local_38;
  if ((checkString_local._7_1_ & 1) == 0) {
    SimpleString::SimpleString(&local_b0,comparisonString_local);
    SimpleString::SimpleString(&local_c0,text_local);
    SimpleString::SimpleString(local_e0,fileName_local);
    ComparisonFailure::ComparisonFailure
              (&local_a0,this,fileName_00,lineNumber,&local_b0,&local_c0,local_e0);
    (*this->_vptr_UtestShell[0x27])(this,&local_a0,testTerminator);
    ComparisonFailure::~ComparisonFailure(&local_a0);
    SimpleString::~SimpleString(local_e0);
    SimpleString::~SimpleString(&local_c0);
    SimpleString::~SimpleString(&local_b0);
  }
  return;
}

Assistant:

void UtestShell::assertCompare(bool comparison, const char *checkString, const char *comparisonString, const char *text, const char *fileName, size_t lineNumber, const TestTerminator &testTerminator)
{
    getTestResult()->countCheck();
    if (!comparison)
        failWith(ComparisonFailure(this, fileName, lineNumber, checkString, comparisonString, text), testTerminator);
}